

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scc.cpp
# Opt level: O1

void __thiscall SCCTest_BigTree_Test::~SCCTest_BigTree_Test(SCCTest_BigTree_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(SCCTest, BigTree) {
  // 012 <- 345 -> 678
  Graph graph(9);
  graph.addEdge(0, 1);
  graph.addEdge(1, 2);
  graph.addEdge(2, 0);

  graph.addEdge(3, 4);
  graph.addEdge(4, 5);
  graph.addEdge(5, 3);

  graph.addEdge(6, 7);
  graph.addEdge(7, 8);
  graph.addEdge(8, 6);

  graph.addEdge(3, 2);
  graph.addEdge(5, 6);

  EXPECT_EQ(getSCCs(graph), (SCCSet{{0, 1, 2}, {3, 4, 5}, {6, 7, 8}}));
}